

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Action<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)> * __thiscall
testing::internal::
OnCallSpec<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)>::GetAction
          (OnCallSpec<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)>
           *this)

{
  int iVar1;
  allocator<char> local_39;
  string local_38;
  
  iVar1 = *(int *)(this + 0xc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,".WillByDefault() must appear exactly once in an ON_CALL().",
             &local_39);
  UntypedOnCallSpecBase::AssertSpecProperty((UntypedOnCallSpecBase *)this,iVar1 == 2,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (Action<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)> *)
         (this + 0x40);
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }